

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O0

FILE * __thiscall FlatFileSeq::Open(FlatFileSeq *this,FlatFilePos *pos,bool read_only)

{
  bool bVar1;
  int iVar2;
  byte in_DL;
  long in_RSI;
  char *__modes;
  long in_FS_OFFSET;
  Level in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  FILE *file;
  path path;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  path *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe98;
  FlatFilePos *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  int iVar3;
  FILE *local_110;
  FILE *local_e0;
  ConstevalFormatString<1U> in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff40;
  char local_30 [40];
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = FlatFilePos::IsNull((FlatFilePos *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (bVar1) {
    local_e0 = (FILE *)0x0;
    goto LAB_00f36728;
  }
  FileName((FlatFileSeq *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
           in_stack_fffffffffffffea8);
  std::filesystem::__cxx11::path::parent_path();
  fs::create_directories(in_stack_fffffffffffffe80);
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  __modes = "rb+";
  if ((in_DL & 1) != 0) {
    __modes = "rb";
  }
  local_110 = fsbridge::fopen(local_30,__modes);
  if ((local_110 == (FILE *)0x0) && ((in_DL & 1) == 0)) {
    local_110 = fsbridge::fopen(local_30,"wb+");
  }
  if (local_110 == (FILE *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    iVar3 = 0;
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe78 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff30,iVar3,
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_00000020,
               in_stack_ffffffffffffff28,in_stack_00000030);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    local_e0 = (FILE *)0x0;
  }
  else {
    if (*(int *)(in_RSI + 4) != 0) {
      iVar2 = fseek(local_110,(ulong)*(uint *)(in_RSI + 4),0);
      if (iVar2 != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe80);
        in_stack_fffffffffffffe78 = 2;
        LogPrintFormatInternal<unsigned_int,std::__cxx11::string>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff30,iVar3,
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_00000020,
                   (ConstevalFormatString<2U>)in_stack_ffffffffffffff28.fmt,
                   (uint *)in_stack_00000030,in_stack_00000038);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        fclose(local_110);
        local_e0 = (FILE *)0x0;
        goto LAB_00f3670a;
      }
    }
    local_e0 = local_110;
  }
LAB_00f3670a:
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
LAB_00f36728:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (FILE *)local_e0;
  }
  __stack_chk_fail();
}

Assistant:

FILE* FlatFileSeq::Open(const FlatFilePos& pos, bool read_only) const
{
    if (pos.IsNull()) {
        return nullptr;
    }
    fs::path path = FileName(pos);
    fs::create_directories(path.parent_path());
    FILE* file = fsbridge::fopen(path, read_only ? "rb": "rb+");
    if (!file && !read_only)
        file = fsbridge::fopen(path, "wb+");
    if (!file) {
        LogPrintf("Unable to open file %s\n", fs::PathToString(path));
        return nullptr;
    }
    if (pos.nPos && fseek(file, pos.nPos, SEEK_SET)) {
        LogPrintf("Unable to seek to position %u of %s\n", pos.nPos, fs::PathToString(path));
        fclose(file);
        return nullptr;
    }
    return file;
}